

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O1

void api_suite::api_expand_back_n(void)

{
  long local_68;
  undefined4 local_5c;
  undefined8 local_58 [2];
  undefined8 *local_48;
  long local_40;
  ulong local_38;
  
  local_48 = local_58;
  local_58[0] = 0xb0000000b;
  local_38 = 6;
  local_40 = 2;
  local_68 = 2;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x112,"void api_suite::api_expand_back_n()",&local_68,&local_5c);
  local_38 = (ulong)((uint)local_38 & 3) ^ 6;
  local_68 = 4;
  if (1 < local_40 - 3U) {
    local_68 = local_40 + 2;
  }
  local_5c = 4;
  local_40 = local_68;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x114,"void api_suite::api_expand_back_n()",&local_68,&local_5c);
  return;
}

Assistant:

void api_expand_back_n()
{
    circular_array<int, 4> data;
    data.push_back(11);
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 2);
    data.expand_back(2);
    BOOST_TEST_EQ(data.size(), 4);
}